

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O3

double Gudhi::Persistence_representations::compute_maximal_distance_non_symmetric
                 (Persistence_landscape *pl1,Persistence_landscape *pl2)

{
  double dVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  ulong uVar5;
  size_t level;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  pvVar2 = (pl1->land).
           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(pl1->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
          -0x5555555555555555;
  pvVar3 = (pl2->land).
           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = ((long)(pl2->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
          -0x5555555555555555;
  uVar8 = uVar5;
  if (uVar6 < uVar5) {
    uVar8 = uVar6;
  }
  if (uVar8 == 0) {
    dVar14 = 0.0;
  }
  else {
    dVar14 = 0.0;
    uVar10 = 0;
    do {
      lVar4 = *(long *)&pvVar2[uVar10].
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl;
      lVar11 = ((long)*(pointer *)
                       ((long)&pvVar2[uVar10].
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               ._M_impl + 8) - lVar4 >> 4) + -1;
      if (lVar11 != 1) {
        lVar7 = 1;
        lVar12 = 0;
        do {
          dVar16 = *(double *)(lVar4 + lVar7 * 0x10);
          lVar12 = (long)(int)lVar12;
          for (pdVar9 = (double *)
                        (lVar12 * 0x10 +
                        *(long *)&pvVar3[uVar10].
                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  ._M_impl + 0x18);
              (dVar1 = pdVar9[-3], dVar16 < dVar1 || (pdVar9[-1] < dVar16)); pdVar9 = pdVar9 + 2) {
            lVar12 = lVar12 + 1;
          }
          dVar15 = (*pdVar9 - pdVar9[-2]) / (pdVar9[-1] - dVar1);
          dVar16 = ABS((dVar15 * dVar16 + (pdVar9[-2] - dVar1 * dVar15)) -
                       *(double *)(lVar4 + lVar7 * 0x10 + 8));
          uVar13 = -(ulong)(dVar14 <= dVar16);
          dVar14 = (double)(~uVar13 & (ulong)dVar14 | (ulong)dVar16 & uVar13);
          lVar7 = lVar7 + 1;
        } while (lVar7 != lVar11);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar8);
  }
  if (uVar6 < uVar5) {
    do {
      lVar4 = *(long *)&pvVar2[uVar6].
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl;
      lVar11 = (long)*(pointer *)
                      ((long)&pvVar2[uVar6].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl + 8) - lVar4;
      if (lVar11 != 0) {
        lVar11 = lVar11 >> 4;
        pdVar9 = (double *)(lVar4 + 8);
        dVar16 = dVar14;
        do {
          dVar14 = *pdVar9;
          if (*pdVar9 <= dVar16) {
            dVar14 = dVar16;
          }
          pdVar9 = pdVar9 + 2;
          lVar11 = lVar11 + -1;
          dVar16 = dVar14;
        } while (lVar11 != 0);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  return dVar14;
}

Assistant:

void Persistence_landscape::load_landscape_from_file(const char* filename) {
  bool dbg = false;
  // removing the current content of the persistence landscape.
  this->land.clear();

  // this constructor reads persistence landscape form a file. This file have to be created by this software before head
  std::ifstream in;
  in.open(filename);
  if (!in.good()) {
    std::cerr << "The file : " << filename << " do not exist. The program will now terminate \n";
    throw "The persistence landscape file do not exist. The program will now terminate \n";
  }

  std::string line;
  std::vector<std::pair<double, double> > landscapeAtThisLevel;

  bool isThisAFirsLine = true;
  while (in.good()) {
    getline(in, line);
    if (!(line.length() == 0 || line[0] == '#')) {
      std::stringstream lineSS;
      lineSS << line;
      double beginn, endd;
      lineSS >> beginn;
      lineSS >> endd;
      landscapeAtThisLevel.push_back(std::make_pair(beginn, endd));
      if (dbg) {
        std::clog << "Reading a point : " << beginn << " , " << endd << std::endl;
      }
    } else {
      if (dbg) {
        std::clog << "IGNORE LINE\n";
        getchar();
      }
      if (!isThisAFirsLine) {
        landscapeAtThisLevel.push_back(std::make_pair(std::numeric_limits<int>::max(), 0));
        this->land.push_back(landscapeAtThisLevel);
        std::vector<std::pair<double, double> > newLevelOdLandscape;
        landscapeAtThisLevel.swap(newLevelOdLandscape);
      }
      landscapeAtThisLevel.push_back(std::make_pair(-std::numeric_limits<int>::max(), 0));
      isThisAFirsLine = false;
    }
  }
  if (landscapeAtThisLevel.size() > 1) {
    // seems that the last line of the file is not finished with the newline sign. We need to put what we have in
    // landscapeAtThisLevel to the constructed landscape.
    landscapeAtThisLevel.push_back(std::make_pair(std::numeric_limits<int>::max(), 0));
    this->land.push_back(landscapeAtThisLevel);
  }

  in.close();
}